

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O2

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::TestBody
          (ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
           *this)

{
  long lVar1;
  int i;
  uint uVar2;
  Particle *pPVar3;
  double *pdVar4;
  char *message;
  byte bVar5;
  Particle<(pica::Dimension)3> in_stack_fffffffffffffe48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  AssertHelper local_168;
  int numParticles;
  AssertionResult gtest_ar;
  ParticleArray particles;
  Particle local_70;
  
  bVar5 = 0;
  memset(&particles,0,0xd8);
  numParticles = 0xc;
  for (uVar2 = 0; uVar2 < 0xc; uVar2 = uVar2 + 1) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (&local_70,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this);
    pPVar3 = &local_70;
    pdVar4 = (double *)&stack0xfffffffffffffe48;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pdVar4 = (pPVar3->position).x;
      pPVar3 = (Particle *)((long)pPVar3 + (ulong)bVar5 * -0x10 + 8);
      pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
    }
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
    pushBack<pica::Particle<(pica::Dimension)3>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)3>> *)&particles,
               in_stack_fffffffffffffe48);
  }
  local_170.ptr_._0_4_ =
       (undefined4)
       ((ulong)((long)particles.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)particles.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"numParticles","particles.size()",&numParticles,(int *)&local_170
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_170);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x45,message);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_170);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::~ParticleArraySoA(&particles);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}